

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassExtensionFieldInfo
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  string *__return_storage_ptr__;
  string local_40;
  
  if (0 < *(int *)(desc + 0x78)) {
    __return_storage_ptr__ = &local_40;
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc
              );
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,
               "\n/**\n * The extensions registered with this message class. This is a map of\n * extension field number to fieldInfo object.\n *\n * For example:\n *     { 123: {fieldIndex: 123, fieldName: {my_field_name: 0}, ctor: proto.example.MyMessage} }\n *\n * fieldName contains the JsCompiler renamed field name property so that it\n * works in OPTIMIZED mode.\n *\n * @type {!Object<number, jspb.ExtensionFieldInfo>}\n */\n$class$.extensions = {};\n\n"
               ,(char (*) [6])0x39aeed,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               (Descriptor *)__return_storage_ptr__);
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,
               "\n/**\n * The extensions registered with this message class. This is a map of\n * extension field number to fieldInfo object.\n *\n * For example:\n *     { 123: {fieldIndex: 123, fieldName: {my_field_name: 0}, ctor: proto.example.MyMessage} }\n *\n * fieldName contains the JsCompiler renamed field name property so that it\n * works in OPTIMIZED mode.\n *\n * @type {!Object<number, jspb.ExtensionFieldBinaryInfo>}\n */\n$class$.extensionsBinary = {};\n\n"
               ,(char (*) [6])0x39aeed,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

bool IsExtendable(const Descriptor* desc) {
  return desc->extension_range_count() > 0;
}